

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_slb_describe_load_balancers.cc
# Opt level: O2

int __thiscall
aliyun::Slb::DescribeLoadBalancers
          (Slb *this,SlbDescribeLoadBalancersRequestType *req,
          SlbDescribeLoadBalancersResponseType *response,SlbErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  ArrayIndex AVar3;
  AliRpcRequest *this_00;
  Value *pVVar4;
  Value *pVVar5;
  Value *pVVar6;
  char *pcVar7;
  allocator<char> aStack_878;
  allocator<char> local_877;
  allocator<char> local_876;
  allocator<char> local_875;
  uint local_874;
  Value val;
  undefined1 local_850 [32];
  _Alloc_hider local_830;
  size_type local_828;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_820;
  _Alloc_hider local_810;
  size_type local_808;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_800;
  _Alloc_hider local_7f0;
  size_type local_7e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7e0;
  _Alloc_hider local_7d0;
  size_type local_7c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7c0;
  _Alloc_hider local_7b0;
  size_type local_7a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7a0;
  _Alloc_hider local_790;
  size_type local_788;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_780;
  _Alloc_hider local_770;
  size_type local_768;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_760;
  _Alloc_hider local_750;
  size_type local_748;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_740;
  _Alloc_hider local_730;
  size_type local_728;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_720;
  _Alloc_hider local_710;
  size_type local_708;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_700;
  _Alloc_hider local_6f0;
  size_type local_6e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6e0;
  Int local_6d0;
  _Alloc_hider local_6c8;
  size_type local_6c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6b8;
  _Alloc_hider local_6a8;
  size_type local_6a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_698;
  Int local_688;
  string str_response;
  string local_660;
  string local_640;
  string local_620;
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string secheme;
  string local_160;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar7 = "http";
  if (this->use_tls_ != false) {
    pcVar7 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar7,(allocator<char> *)local_850);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->version_,(allocator<char> *)&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,this->appid_,(allocator<char> *)&local_160);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,this->secret_,(allocator<char> *)&val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_850,
                 &secheme,"://");
  std::operator+(&local_200,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_850,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_1a0,&local_1c0,&local_1e0,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)local_850);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  if (((this->use_tls_ == false) && (pcVar7 = this->proxy_host_, pcVar7 != (char *)0x0)) &&
     (*pcVar7 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,pcVar7,(allocator<char> *)local_850);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"Action",(allocator<char> *)local_850);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"DescribeLoadBalancers",(allocator<char> *)&local_160);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  if ((req->owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"OwnerId",(allocator<char> *)local_850);
    std::__cxx11::string::string((string *)&local_2a0,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_280);
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,"ResourceOwnerAccount",(allocator<char> *)local_850);
    std::__cxx11::string::string((string *)&local_2e0,(string *)&req->resource_owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2c0,&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2c0);
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"ResourceOwnerId",(allocator<char> *)local_850);
    std::__cxx11::string::string((string *)&local_320,(string *)&req->resource_owner_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_300,&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_300);
  }
  if ((req->server_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_340,"ServerId",(allocator<char> *)local_850);
    std::__cxx11::string::string((string *)&local_360,(string *)&req->server_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_340,&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_340);
  }
  if ((req->load_balancer_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_380,"LoadBalancerId",(allocator<char> *)local_850);
    std::__cxx11::string::string((string *)&local_3a0,(string *)&req->load_balancer_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_380,&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_380);
  }
  if ((req->address_type)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c0,"AddressType",(allocator<char> *)local_850);
    std::__cxx11::string::string((string *)&local_3e0,(string *)&req->address_type);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3c0,&local_3e0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_3c0);
  }
  if ((req->internet_charge_type)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_400,"InternetChargeType",(allocator<char> *)local_850);
    std::__cxx11::string::string((string *)&local_420,(string *)&req->internet_charge_type);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_400,&local_420);
    std::__cxx11::string::~string((string *)&local_420);
    std::__cxx11::string::~string((string *)&local_400);
  }
  if ((req->vpc_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_440,"VpcId",(allocator<char> *)local_850);
    std::__cxx11::string::string((string *)&local_460,(string *)&req->vpc_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_440,&local_460);
    std::__cxx11::string::~string((string *)&local_460);
    std::__cxx11::string::~string((string *)&local_440);
  }
  if ((req->vswitch_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_480,"VSwitchId",(allocator<char> *)local_850);
    std::__cxx11::string::string((string *)&local_4a0,(string *)&req->vswitch_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_480,&local_4a0);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::string::~string((string *)&local_480);
  }
  if ((req->network_type)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4c0,"NetworkType",(allocator<char> *)local_850);
    std::__cxx11::string::string((string *)&local_4e0,(string *)&req->network_type);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_4c0,&local_4e0);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::__cxx11::string::~string((string *)&local_4c0);
  }
  if ((req->address)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_500,"Address",(allocator<char> *)local_850);
    std::__cxx11::string::string((string *)&local_520,(string *)&req->address);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_500,&local_520);
    std::__cxx11::string::~string((string *)&local_520);
    std::__cxx11::string::~string((string *)&local_500);
  }
  if ((req->security_status)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_540,"SecurityStatus",(allocator<char> *)local_850);
    std::__cxx11::string::string((string *)&local_560,(string *)&req->security_status);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_540,&local_560);
    std::__cxx11::string::~string((string *)&local_560);
    std::__cxx11::string::~string((string *)&local_540);
  }
  if ((req->master_zone_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_580,"MasterZoneId",(allocator<char> *)local_850);
    std::__cxx11::string::string((string *)&local_5a0,(string *)&req->master_zone_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_580,&local_5a0);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::__cxx11::string::~string((string *)&local_580);
  }
  if ((req->slave_zone_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5c0,"SlaveZoneId",(allocator<char> *)local_850);
    std::__cxx11::string::string((string *)&local_5e0,(string *)&req->slave_zone_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_5c0,&local_5e0);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::__cxx11::string::~string((string *)&local_5c0);
  }
  if ((req->owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_600,"OwnerAccount",(allocator<char> *)local_850);
    std::__cxx11::string::string((string *)&local_620,(string *)&req->owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_600,&local_620);
    std::__cxx11::string::~string((string *)&local_620);
    std::__cxx11::string::~string((string *)&local_600);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_640,"RegionId",(allocator<char> *)local_850);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_660,this->region_id_,(allocator<char> *)&local_160);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_640,&local_660);
    std::__cxx11::string::~string((string *)&local_660);
    std::__cxx11::string::~string((string *)&local_640);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (SlbErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_850,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_850,anon_var_dwarf_169eda + 9,&local_875);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_850);
        std::__cxx11::string::~string((string *)local_850);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_850,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_850,anon_var_dwarf_169eda + 9,&local_876);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_850);
        std::__cxx11::string::~string((string *)local_850);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_850,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_850,anon_var_dwarf_169eda + 9,&local_877);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_850);
        std::__cxx11::string::~string((string *)local_850);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_850,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_850,anon_var_dwarf_169eda + 9,&aStack_878);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_850);
        std::__cxx11::string::~string((string *)local_850);
      }
      if (response != (SlbDescribeLoadBalancersResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"LoadBalancers");
        iVar2 = 200;
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"LoadBalancers");
          bVar1 = Json::Value::isMember(pVVar4,"LoadBalancer");
          if (bVar1) {
            pVVar4 = Json::Value::operator[](&val,"LoadBalancers");
            pVVar4 = Json::Value::operator[](pVVar4,"LoadBalancer");
            bVar1 = Json::Value::isArray(pVVar4);
            if (bVar1) {
              local_874 = 0;
              while (AVar3 = Json::Value::size(pVVar4), local_874 < AVar3) {
                local_850._0_8_ = local_850 + 0x10;
                local_850._8_8_ = 0;
                local_850[0x10] = '\0';
                local_830._M_p = (pointer)&local_820;
                local_828 = 0;
                local_820._M_local_buf[0] = '\0';
                local_810._M_p = (pointer)&local_800;
                local_808 = 0;
                local_800._M_local_buf[0] = '\0';
                local_7f0._M_p = (pointer)&local_7e0;
                local_7e8 = 0;
                local_7e0._M_local_buf[0] = '\0';
                local_7d0._M_p = (pointer)&local_7c0;
                local_7c8 = 0;
                local_7c0._M_local_buf[0] = '\0';
                local_7b0._M_p = (pointer)&local_7a0;
                local_7a8 = 0;
                local_7a0._M_local_buf[0] = '\0';
                local_790._M_p = (pointer)&local_780;
                local_788 = 0;
                local_780._M_local_buf[0] = '\0';
                local_770._M_p = (pointer)&local_760;
                local_768 = 0;
                local_760._M_local_buf[0] = '\0';
                local_750._M_p = (pointer)&local_740;
                local_748 = 0;
                local_740._M_local_buf[0] = '\0';
                local_730._M_p = (pointer)&local_720;
                local_728 = 0;
                local_720._M_local_buf[0] = '\0';
                local_710._M_p = (pointer)&local_700;
                local_708 = 0;
                local_700._M_local_buf[0] = '\0';
                local_6f0._M_p = (pointer)&local_6e0;
                local_6e8 = 0;
                local_6e0._M_local_buf[0] = '\0';
                local_6c8._M_p = (pointer)&local_6b8;
                local_6c0 = 0;
                local_6b8._M_local_buf[0] = '\0';
                local_6a8._M_p = (pointer)&local_698;
                local_6a0 = 0;
                local_698._M_local_buf[0] = '\0';
                pVVar5 = Json::Value::operator[](pVVar4,local_874);
                bVar1 = Json::Value::isMember(pVVar5,"LoadBalancerId");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"LoadBalancerId");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)local_850,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"LoadBalancerName");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"LoadBalancerName");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_830,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"LoadBalancerStatus");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"LoadBalancerStatus");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_810,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"Address");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"Address");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_7f0,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"AddressType");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"AddressType");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_7d0,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"RegionId");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"RegionId");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_7b0,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"RegionIdAlias");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"RegionIdAlias");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_790,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"VSwitchId");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"VSwitchId");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_770,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"VpcId");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"VpcId");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_750,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"NetworkType");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"NetworkType");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_730,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"MasterZoneId");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"MasterZoneId");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_710,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"SlaveZoneId");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"SlaveZoneId");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_6f0,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"MaxConnLimit");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"MaxConnLimit");
                  local_6d0 = Json::Value::asInt(pVVar6);
                }
                bVar1 = Json::Value::isMember(pVVar5,"SecurityStatus");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"SecurityStatus");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_6c8,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"InternetChargeType");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"InternetChargeType");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_6a8,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"SysBandwidth");
                if (bVar1) {
                  pVVar5 = Json::Value::operator[](pVVar5,"SysBandwidth");
                  local_688 = Json::Value::asInt(pVVar5);
                }
                std::
                vector<aliyun::SlbDescribeLoadBalancersLoadBalancerType,_std::allocator<aliyun::SlbDescribeLoadBalancersLoadBalancerType>_>
                ::push_back(&response->load_balancers,(value_type *)local_850);
                SlbDescribeLoadBalancersLoadBalancerType::~SlbDescribeLoadBalancersLoadBalancerType
                          ((SlbDescribeLoadBalancersLoadBalancerType *)local_850);
                local_874 = local_874 + 1;
              }
            }
          }
        }
      }
      goto LAB_001400a3;
    }
  }
  iVar2 = -1;
  if (error_info != (SlbErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_001400a3:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Slb::DescribeLoadBalancers(const SlbDescribeLoadBalancersRequestType& req,
                      SlbDescribeLoadBalancersResponseType* response,
                       SlbErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeLoadBalancers");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.server_id.empty()) {
    req_rpc->AddRequestQuery("ServerId", req.server_id);
  }
  if(!req.load_balancer_id.empty()) {
    req_rpc->AddRequestQuery("LoadBalancerId", req.load_balancer_id);
  }
  if(!req.address_type.empty()) {
    req_rpc->AddRequestQuery("AddressType", req.address_type);
  }
  if(!req.internet_charge_type.empty()) {
    req_rpc->AddRequestQuery("InternetChargeType", req.internet_charge_type);
  }
  if(!req.vpc_id.empty()) {
    req_rpc->AddRequestQuery("VpcId", req.vpc_id);
  }
  if(!req.vswitch_id.empty()) {
    req_rpc->AddRequestQuery("VSwitchId", req.vswitch_id);
  }
  if(!req.network_type.empty()) {
    req_rpc->AddRequestQuery("NetworkType", req.network_type);
  }
  if(!req.address.empty()) {
    req_rpc->AddRequestQuery("Address", req.address);
  }
  if(!req.security_status.empty()) {
    req_rpc->AddRequestQuery("SecurityStatus", req.security_status);
  }
  if(!req.master_zone_id.empty()) {
    req_rpc->AddRequestQuery("MasterZoneId", req.master_zone_id);
  }
  if(!req.slave_zone_id.empty()) {
    req_rpc->AddRequestQuery("SlaveZoneId", req.slave_zone_id);
  }
  if(!req.owner_account.empty()) {
    req_rpc->AddRequestQuery("OwnerAccount", req.owner_account);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}